

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pgm1394.cpp
# Opt level: O3

bool PromProgramTest(AmpIO *Board)

{
  bool bVar1;
  int iVar2;
  long lVar3;
  ostream *poVar4;
  ostream *poVar5;
  uint8_t uVar6;
  uint8_t uVar7;
  uint8_t uVar8;
  uint8_t uVar9;
  uint8_t uVar10;
  uint8_t uVar11;
  uint8_t uVar12;
  uint8_t uVar13;
  uint8_t uVar14;
  uint8_t uVar15;
  uint8_t uVar16;
  uint8_t uVar17;
  uint8_t uVar18;
  uint8_t uVar19;
  uint8_t uVar20;
  uint8_t uVar21;
  uchar testBuffer [256];
  uchar readBuffer [256];
  uint8_t local_228 [512];
  
  uVar6 = '\0';
  uVar7 = '\x01';
  uVar8 = '\x02';
  uVar9 = '\x03';
  uVar10 = '\x04';
  uVar11 = '\x05';
  uVar12 = '\x06';
  uVar13 = '\a';
  uVar14 = '\b';
  uVar15 = '\t';
  uVar16 = '\n';
  uVar17 = '\v';
  uVar18 = '\f';
  uVar19 = '\r';
  uVar20 = '\x0e';
  uVar21 = '\x0f';
  lVar3 = 0;
  do {
    local_228[lVar3] = uVar6;
    local_228[lVar3 + 1] = uVar7;
    local_228[lVar3 + 2] = uVar8;
    local_228[lVar3 + 3] = uVar9;
    local_228[lVar3 + 4] = uVar10;
    local_228[lVar3 + 5] = uVar11;
    local_228[lVar3 + 6] = uVar12;
    local_228[lVar3 + 7] = uVar13;
    local_228[lVar3 + 8] = uVar14;
    local_228[lVar3 + 9] = uVar15;
    local_228[lVar3 + 10] = uVar16;
    local_228[lVar3 + 0xb] = uVar17;
    local_228[lVar3 + 0xc] = uVar18;
    local_228[lVar3 + 0xd] = uVar19;
    local_228[lVar3 + 0xe] = uVar20;
    local_228[lVar3 + 0xf] = uVar21;
    lVar3 = lVar3 + 0x10;
    uVar6 = uVar6 + '\x10';
    uVar7 = uVar7 + '\x10';
    uVar8 = uVar8 + '\x10';
    uVar9 = uVar9 + '\x10';
    uVar10 = uVar10 + '\x10';
    uVar11 = uVar11 + '\x10';
    uVar12 = uVar12 + '\x10';
    uVar13 = uVar13 + '\x10';
    uVar14 = uVar14 + '\x10';
    uVar15 = uVar15 + '\x10';
    uVar16 = uVar16 + '\x10';
    uVar17 = uVar17 + '\x10';
    uVar18 = uVar18 + '\x10';
    uVar19 = uVar19 + '\x10';
    uVar20 = uVar20 + '\x10';
    uVar21 = uVar21 + '\x10';
  } while (lVar3 != 0x100);
  poVar5 = (ostream *)&std::cout;
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"Testing PROM programming",0x18);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + '@');
  std::ostream::put('@');
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"  Erasing sector 1E0000 ",0x18);
  std::ostream::flush();
  FpgaIO::PromSectorErase(&Board->super_FpgaIO,0x1e0000,PromProgramCallback);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + '@');
  std::ostream::put('@');
  poVar4 = (ostream *)std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>(poVar4,"  Programming first page ",0x19);
  std::ostream::flush();
  iVar2 = FpgaIO::PromProgramPage(&Board->super_FpgaIO,0x1eff00,local_228,0x100,PromProgramCallback)
  ;
  if (iVar2 == 0x100) {
    Amp1394_Sleep(0.005);
    std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + '@');
    std::ostream::put('@');
    poVar4 = (ostream *)std::ostream::flush();
    std::__ostream_insert<char,std::char_traits<char>>(poVar4,"  Reading first page ",0x15);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar4 + -0x18) + (char)poVar4);
    std::ostream::put((char)poVar4);
    std::ostream::flush();
    bVar1 = FpgaIO::PromReadData(&Board->super_FpgaIO,0x1eff00,local_228 + 0x100,0x100);
    if (bVar1) {
      lVar3 = 0;
      do {
        if (local_228[lVar3] != local_228[lVar3 + 0x100]) {
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&std::cout,"  Mismatch at offset ",0x15);
          poVar4 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cout);
          std::__ostream_insert<char,std::char_traits<char>>(poVar4,": wrote ",8);
          poVar4 = std::ostream::_M_insert<unsigned_long>((ulong)poVar4);
          std::__ostream_insert<char,std::char_traits<char>>(poVar4,", read ",7);
          poVar5 = std::ostream::_M_insert<unsigned_long>((ulong)poVar4);
          goto LAB_00106549;
        }
        lVar3 = lVar3 + 1;
      } while (lVar3 != 0x100);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cout,"PROM programming test successful",0x20);
      bVar1 = true;
      goto LAB_0010654b;
    }
    poVar5 = (ostream *)&std::cerr;
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,"  Error reading PROM data",0x19);
  }
  else {
    std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + '@');
    std::ostream::put('@');
    poVar4 = (ostream *)std::ostream::flush();
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar4,"  Cannot program test pattern, ret = ",0x25);
    poVar5 = (ostream *)std::ostream::operator<<((ostream *)poVar4,iVar2);
  }
LAB_00106549:
  bVar1 = false;
LAB_0010654b:
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar5 + -0x18) + (char)poVar5);
  std::ostream::put((char)poVar5);
  std::ostream::flush();
  return bVar1;
}

Assistant:

bool PromProgramTest(AmpIO &Board)
{
    unsigned char testBuffer[256];
    unsigned char readBuffer[256];
    size_t i;
    for (i = 0; i < sizeof(testBuffer); i++)
        testBuffer[i] = static_cast<unsigned char>(i);

    std::cout << "Testing PROM programming" << std::endl;
    std::cout << "  Erasing sector 1E0000 " << std::flush;
    Board.PromSectorErase(0x1E0000, PromProgramCallback);
    std::cout << std::endl << "  Programming first page " << std::flush;
    int ret = Board.PromProgramPage(0x1EFF00, (uint8_t*)testBuffer, sizeof(testBuffer), PromProgramCallback);
    if (ret != sizeof(testBuffer)) {
        std::cout << std::endl << "  Cannot program test pattern, ret = " << ret << std::endl;
        return false;
    }
    Amp1394_Sleep(0.005);
    std::cout << std::endl << "  Reading first page " << std::endl;
    if (!Board.PromReadData(0x1EFF00, readBuffer, sizeof(readBuffer))) {
        std::cerr << "  Error reading PROM data" << std::endl;
        return false;
    }
    // Compare bytes
    for (i = 0; i < sizeof(testBuffer); i++) {
        if (testBuffer[i] != readBuffer[i]) {
            std::cout << "  Mismatch at offset " << i << ": wrote " << static_cast<unsigned int>(testBuffer[i])
                      << ", read " << static_cast<unsigned int>(readBuffer[i]) << std::endl;
            return false;
        }
    }
    std::cout << "PROM programming test successful" << std::endl;
    return true;
}